

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O1

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi)

{
  int iVar1;
  MV_REFERENCE_FRAME ref;
  long lVar2;
  int iVar3;
  InterpFilter ifilter;
  long lVar4;
  int iVar5;
  RefCntBuffer *pRVar6;
  int local_38 [6];
  int ref_total [8];
  
  local_38[4] = 0;
  local_38[5] = 0;
  ref_total[0] = 0;
  ref_total[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  if ((cpi->last_frame_type != '\0') && ((cpi->refresh_frame).alt_ref_frame == false)) {
    lVar2 = 1;
    do {
      iVar3 = local_38[lVar2];
      iVar1 = (cpi->common).remapped_ref_idx[(int)lVar2 - 1];
      lVar4 = 0;
      do {
        if (iVar1 == -1) {
          pRVar6 = (RefCntBuffer *)0x0;
        }
        else {
          pRVar6 = (cpi->common).ref_frame_map[iVar1];
        }
        if (pRVar6 == (RefCntBuffer *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar5 = pRVar6->interp_filter_selected[lVar4];
        }
        iVar3 = iVar3 + iVar5;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_38[lVar2] = iVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0xc);
  }
  return 0x1ff;
}

Assistant:

uint16_t av1_setup_interp_filter_search_mask(AV1_COMP *cpi) {
  const AV1_COMMON *const cm = &cpi->common;
  int ref_total[REF_FRAMES] = { 0 };
  uint16_t mask = ALLOW_ALL_INTERP_FILT_MASK;

  if (cpi->last_frame_type == KEY_FRAME || cpi->refresh_frame.alt_ref_frame)
    return mask;

  for (MV_REFERENCE_FRAME ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
    for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
         ++ifilter) {
      ref_total[ref] += get_interp_filter_selected(cm, ref, ifilter);
    }
  }
  int ref_total_total = (ref_total[LAST2_FRAME] + ref_total[LAST3_FRAME] +
                         ref_total[GOLDEN_FRAME] + ref_total[BWDREF_FRAME] +
                         ref_total[ALTREF2_FRAME] + ref_total[ALTREF_FRAME]);

  for (InterpFilter ifilter = EIGHTTAP_REGULAR; ifilter <= MULTITAP_SHARP;
       ++ifilter) {
    int last_score = get_interp_filter_selected(cm, LAST_FRAME, ifilter) * 30;
    if (ref_total[LAST_FRAME] && last_score <= ref_total[LAST_FRAME]) {
      int filter_score =
          get_interp_filter_selected(cm, LAST2_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, LAST3_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, GOLDEN_FRAME, ifilter) * 20 +
          get_interp_filter_selected(cm, BWDREF_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF2_FRAME, ifilter) * 10 +
          get_interp_filter_selected(cm, ALTREF_FRAME, ifilter) * 10;
      if (filter_score < ref_total_total) {
        DUAL_FILTER_TYPE filt_type = ifilter + SWITCHABLE_FILTERS * ifilter;
        reset_interp_filter_allowed_mask(&mask, filt_type);
      }
    }
  }
  return mask;
}